

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

TranslationBlock_conflict *
tb_gen_code_sparc(CPUState *cpu,target_ulong_conflict pc,target_ulong_conflict cs_base,
                 uint32_t flags,int cflags)

{
  undefined4 uVar1;
  TCGContext_conflict6 *s;
  CPUArchState_conflict16 *pCVar2;
  TCGContext_conflict6 *pTVar3;
  byte *pbVar4;
  uc_struct_conflict7 *uc;
  uintptr_t uVar5;
  long *plVar6;
  PageDesc *pPVar7;
  tb_page_addr_t tVar8;
  TranslationBlock *pTVar9;
  ulong extraout_RAX;
  TranslationBlock *tb;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  undefined4 in_register_00000034;
  ulong uVar17;
  int iVar18;
  byte bVar19;
  tb_page_addr_t phys2;
  bool bVar20;
  bool bVar21;
  PageDesc *p2;
  PageDesc *p;
  PageDesc *local_90;
  uint local_88;
  undefined4 uStack_84;
  void *local_80;
  uint32_t local_78;
  uint local_74;
  target_ulong_conflict local_70;
  uint32_t local_6c;
  byte *local_68;
  tb_page_addr_t local_60;
  undefined8 local_58;
  CPUArchState_conflict16 *local_50;
  void *local_48;
  CPUState *local_40;
  TranslationBlock *local_38;
  
  local_58 = CONCAT44(in_register_00000034,pc);
  uVar10 = (ulong)flags;
  s = cpu->uc->tcg_ctx;
  pCVar2 = (CPUArchState_conflict16 *)cpu->env_ptr;
  local_70 = cs_base;
  local_6c = flags;
  local_60 = get_page_addr_code_sparc(pCVar2,pc);
  uVar15 = cflags | 0x10000;
  if (local_60 != 0xffffffffffffffff) {
    uVar15 = cflags;
  }
  uVar14 = cpu->cluster_index;
  tb = (TranslationBlock *)(ulong)uVar14;
  iVar18 = cpu->singlestep_enabled;
  pTVar9 = tcg_tb_alloc_sparc((TCGContext_conflict7 *)s);
  if (pTVar9 == (TranslationBlock *)0x0) {
LAB_00a0385b:
    tb_gen_code_sparc_cold_2();
LAB_00a03865:
    (tb->tc).ptr = local_48;
    s->code_gen_ptr =
         (void *)((long)local_80 + (long)local_48 + (uVar10 & 0xffffffff) + 0xf & 0xfffffffffffffff0
                 );
    tb->jmp_list_next[0] = 0;
    tb->jmp_list_next[1] = 0;
    *(undefined1 (*) [16])(tb->jmp_target_arg + 1) = (undefined1  [16])0x0;
    tb->jmp_dest[0] = 0;
    uVar10 = (ulong)(ushort)tb->page_addr[1];
    if (uVar10 != 0xffff) {
      tb_set_jmp_target_sparc(tb,0,uVar10 + *(long *)&tb->cflags);
    }
    pCVar2 = local_50;
    if (*(short *)((long)tb->page_addr + 10) != -1) {
      tb_set_jmp_target_sparc
                (tb,1,(ulong)*(ushort *)((long)tb->page_addr + 10) + *(long *)&tb->cflags);
    }
    uVar15 = ((uint)local_58 + (uint)*(ushort *)((long)&tb->cs_base + 4)) - 1 & 0xfffff000;
    phys2 = 0xffffffffffffffff;
    if (((uint)local_58 & 0xfffff000) != uVar15) {
      phys2 = get_page_addr_code_sparc(pCVar2,uVar15);
    }
    tVar8 = local_60;
    uc = cpu->uc;
    local_90 = (PageDesc *)0x0;
    pTVar9 = tb;
    if (local_60 == 0xffffffffffffffff) {
      if ((tb->flags & 0x10000) == 0) {
        __assert_fail("tb->cflags & CF_NOCACHE",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                      ,0x66c,
                      "TranslationBlock *tb_link_page(struct uc_struct *, TranslationBlock *, tb_page_addr_t, tb_page_addr_t)"
                     );
      }
      *(undefined4 *)(tb->page_next + 1) = 0xffffffff;
      *(undefined4 *)((long)tb->page_next + 0xc) = 0xffffffff;
      *(undefined4 *)tb->page_addr = 0xffffffff;
      *(undefined4 *)((long)tb->page_addr + 4) = 0xffffffff;
    }
    else {
      page_lock_pair((uc_struct_conflict8 *)uc,(PageDesc **)&local_88,local_60,&local_90,phys2,1);
      plVar6 = (long *)CONCAT44(uStack_84,local_88);
      uVar10 = (ulong)((uint)tVar8 & 0xfffff000);
      tb->page_next[1] = uVar10;
      tb->orig_tb = (TranslationBlock *)*plVar6;
      lVar13 = *plVar6;
      *plVar6 = (long)tb;
      g_free((gpointer)plVar6[1]);
      plVar6[1] = 0;
      *(undefined4 *)(plVar6 + 2) = 0;
      if (lVar13 == 0) {
        tlb_protect_code_sparc((uc_struct_conflict8 *)uc,uVar10);
      }
      pPVar7 = local_90;
      if (local_90 == (PageDesc *)0x0) {
        tb->page_addr[0] = 0xffffffffffffffff;
      }
      else {
        tb->page_addr[0] = phys2;
        tb->page_next[0] = local_90->first_tb;
        uVar5 = local_90->first_tb;
        local_90->first_tb = (ulong)tb | 1;
        g_free(local_90->code_bitmap);
        pPVar7->code_bitmap = (unsigned_long *)0x0;
        pPVar7->code_write_count = 0;
        if (uVar5 == 0) {
          tlb_protect_code_sparc((uc_struct_conflict8 *)uc,phys2);
        }
      }
      if ((tb->flags >> 0x10 & 1) == 0) {
        local_38 = (TranslationBlock *)0x0;
        uVar15 = (int)local_60 * -0x7a143589 + 0x24234429;
        uVar14 = uVar15 * 0x2000 | uVar15 >> 0x13;
        uVar15 = (int)(local_60 >> 0x20) * -0x7a143589 + 0x85ebca78;
        uVar15 = uVar15 * 0x2000 | uVar15 >> 0x13;
        uVar16 = (int)tb->pc * -0x7a143589 + 1;
        uVar16 = uVar16 * 0x2000 | uVar16 >> 0x13;
        uVar15 = (uVar16 * 0x779b1000 | uVar16 * -0x61c8864f >> 0x14) +
                 (int)tb->cs_base * -0x3d4d51c3 +
                 (uVar14 * 0x3c6ef362 | (uint)((int)(uVar14 * -0x61c8864f) < 0)) +
                 (uVar15 * 0x1bbcd880 | uVar15 * -0x61c8864f >> 0x19) + 0x91a7a6fd;
        uVar15 = (tb->flags & 0xff0affff) * -0x3d4d51c3 +
                 (uVar15 * 0x20000 | uVar15 >> 0xf) * 0x27d4eb2f;
        uVar15 = *(int *)&tb->size * -0x3d4d51c3 + (uVar15 * 0x20000 | uVar15 >> 0xf) * 0x27d4eb2f;
        uVar15 = (uVar15 * 0x20000 | uVar15 >> 0xf) * 0x27d4eb2f;
        uVar15 = (uVar15 >> 0xf ^ uVar15) * -0x7a143589;
        uVar15 = (uVar15 >> 0xd ^ uVar15) * -0x3d4d51c3;
        uVar15 = uVar15 >> 0x10 ^ uVar15;
        *(uint *)(tb->jmp_dest + 1) = uVar15;
        qht_insert((uc_struct_conflict5 *)uc,(qht *)(uc->tcg_ctx->gen_insn_data[0xaa] + 2),tb,uVar15
                   ,&local_38);
        if (local_38 != (TranslationBlock *)0x0) {
          tb_page_remove((PageDesc *)CONCAT44(uStack_84,local_88),(TranslationBlock_conflict *)tb);
          lVar13 = CONCAT44(uStack_84,local_88);
          g_free(*(gpointer *)(lVar13 + 8));
          *(undefined8 *)(lVar13 + 8) = 0;
          *(undefined4 *)(lVar13 + 0x10) = 0;
          pTVar9 = local_38;
          if (local_90 != (PageDesc *)0x0) {
            tb_page_remove(local_90,(TranslationBlock_conflict *)tb);
            pPVar7 = local_90;
            g_free(local_90->code_bitmap);
            pPVar7->code_bitmap = (unsigned_long *)0x0;
            pPVar7->code_write_count = 0;
            pTVar9 = local_38;
          }
        }
      }
    }
    if (pTVar9 == tb) {
      tcg_tb_insert_sparc((TCGContext_conflict7 *)s,tb);
      pTVar9 = tb;
    }
    else {
      lVar13 = (long)((uc_struct_conflict8 *)s->gen_insn_data[0xb2][1])->qemu_icache_linesize;
      s->code_gen_ptr = (void *)((long)local_80 - (-lVar13 & lVar13 + 0x97U));
    }
    return (TranslationBlock_conflict *)pTVar9;
  }
  local_78 = uVar14 << 0x18 | uVar15 & 0xffffff;
  uVar15 = uVar15 & 0x7fff;
  uVar14 = 0x200;
  if (uVar15 < 0x200) {
    uVar14 = uVar15;
  }
  if (uVar15 == 0) {
    uVar14 = 0x200;
  }
  uVar10 = (ulong)uVar14;
  uVar15 = 1;
  if (iVar18 == 0) {
    uVar15 = uVar14;
  }
  local_40 = (CPUState *)(pCVar2[-0xd].regbase + 0x26);
  tb = pTVar9;
  local_50 = pCVar2;
LAB_00a03621:
  local_80 = s->code_gen_ptr;
  *(void **)&tb->cflags = local_80;
  *(int *)&tb->pc = (int)local_58;
  *(target_ulong_conflict *)((long)&tb->pc + 4) = local_70;
  *(uint32_t *)&tb->cs_base = local_6c;
  tb->flags = local_78;
  (tb->tc).size = 0;
  uVar1 = (undefined4)cpu->trace_dstate[0];
  tb->size = (short)uVar1;
  tb->icount = (short)((uint)uVar1 >> 0x10);
  s->tb_cflags = local_78;
  do {
    tcg_func_start_sparc((TCGContext_conflict7 *)s);
    s->cpu = local_40;
    local_74 = uVar15;
    gen_intermediate_code_sparc(cpu,(TranslationBlock_conflict *)tb,uVar15);
    s->cpu = (CPUState *)0x0;
    *(undefined4 *)(tb->page_addr + 1) = 0xffffffff;
    s->tb_jmp_reset_offset = (uint16_t *)(tb->page_addr + 1);
    s->tb_jmp_insn_offset = (uintptr_t *)tb->jmp_reset_offset;
    s->tb_jmp_target_addr = (uintptr_t *)0x0;
    uVar15 = tcg_gen_code_sparc((TCGContext_conflict7 *)s,tb);
    if (-1 < (int)uVar15) {
      local_48 = (void *)(ulong)uVar15;
      local_68 = (byte *)((long)local_48 + (long)local_80);
      uVar10 = (ulong)*(ushort *)((long)&tb->cs_base + 6);
      pbVar12 = local_68;
      if (uVar10 == 0) goto LAB_00a0382a;
      pTVar3 = cpu->uc->tcg_ctx;
      pbVar4 = (byte *)pTVar3->code_gen_highwater;
      uVar17 = 0;
      goto LAB_00a0373b;
    }
    tb_gen_code_sparc_cold_1();
    uVar15 = local_88;
  } while ((extraout_RAX & 1) == 0);
  goto LAB_00a0383e;
  while (uVar17 = uVar17 + 1, uVar17 != uVar10) {
LAB_00a0373b:
    lVar13 = 0;
    do {
      if (uVar17 == 0) {
        iVar18 = 0;
        if (lVar13 == 0) {
          iVar18 = (int)tb->pc;
        }
      }
      else {
        iVar18 = *(int *)((long)(pTVar3->gen_insn_data + -1) + (uVar17 * 4 + lVar13 * 2 + 8) * 2);
      }
      pbVar11 = pbVar12;
      uVar15 = *(int *)((long)pTVar3->gen_insn_data[0] + lVar13 * 4 + uVar17 * 8) - iVar18;
      do {
        uVar14 = (int)uVar15 >> 7;
        bVar20 = 0x3f < uVar15;
        bVar21 = (uVar15 & 0x40) == 0;
        pbVar12 = pbVar11 + 1;
        bVar19 = (byte)uVar15 | 0x80;
        if (!bVar20 || !bVar21 && uVar14 == 0xffffffff) {
          bVar19 = (byte)uVar15 & 0x7f;
        }
        *pbVar11 = bVar19;
        pbVar11 = pbVar12;
        uVar15 = uVar14;
      } while (bVar20 && (bVar21 || uVar14 != 0xffffffff));
      bVar20 = lVar13 == 0;
      lVar13 = lVar13 + 1;
    } while (bVar20);
    if (uVar17 == 0) {
      uVar15 = 0;
    }
    else {
      uVar15 = (uint)pTVar3->gen_insn_end_off[uVar17 - 1];
    }
    uVar15 = pTVar3->gen_insn_end_off[uVar17] - uVar15;
    do {
      uVar14 = (int)uVar15 >> 7;
      bVar20 = 0x3f < uVar15;
      bVar21 = (uVar15 & 0x40) == 0;
      pbVar12 = pbVar11 + 1;
      bVar19 = (byte)uVar15 | 0x80;
      if (!bVar20 || !bVar21 && uVar14 == 0xffffffff) {
        bVar19 = (byte)uVar15 & 0x7f;
      }
      *pbVar11 = bVar19;
      pbVar11 = pbVar12;
      uVar15 = uVar14;
    } while (bVar20 && (bVar21 || uVar14 != 0xffffffff));
    if (pbVar4 < pbVar12) {
      uVar10 = 0xffffffff;
      goto LAB_00a03835;
    }
  }
LAB_00a0382a:
  uVar10 = (ulong)(uint)((int)pbVar12 - (int)local_68);
LAB_00a03835:
  if (-1 < (int)uVar10) goto LAB_00a03865;
LAB_00a0383e:
  tb = tcg_tb_alloc_sparc((TCGContext_conflict7 *)s);
  uVar15 = local_74;
  if (tb == (TranslationBlock *)0x0) goto LAB_00a0385b;
  goto LAB_00a03621;
}

Assistant:

TranslationBlock *tb_gen_code(CPUState *cpu,
                              target_ulong pc, target_ulong cs_base,
                              uint32_t flags, int cflags)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    CPUArchState *env = cpu->env_ptr;
    TranslationBlock *tb, *existing_tb;
    tb_page_addr_t phys_pc, phys_page2;
    target_ulong virt_page2;
    tcg_insn_unit *gen_code_buf;
    int gen_code_size, search_size, max_insns;

    assert_memory_lock();
#ifdef HAVE_PTHREAD_JIT_PROTECT
    tb_exec_unlock(tcg_ctx);
#endif
    phys_pc = get_page_addr_code(env, pc);

    if (phys_pc == -1) {
        /* Generate a temporary TB; do not cache */
        cflags |= CF_NOCACHE;
    }

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    max_insns = cflags & CF_COUNT_MASK;
    if (max_insns == 0) {
        max_insns = CF_COUNT_MASK;
    }
    if (max_insns > TCG_MAX_INSNS) {
        max_insns = TCG_MAX_INSNS;
    }
    if (cpu->singlestep_enabled) {
        max_insns = 1;
    }

 buffer_overflow:
    tb = tcg_tb_alloc(tcg_ctx);
    if (unlikely(!tb)) {
        /* flush must be done */
        tb_flush(cpu);
        mmap_unlock();
        /* Make the execution loop process the flush as soon as possible.  */
        cpu->exception_index = EXCP_INTERRUPT;
        cpu_loop_exit(cpu);
    }

    gen_code_buf = tcg_ctx->code_gen_ptr;
    tb->tc.ptr = gen_code_buf;
    tb->pc = pc;
    tb->cs_base = cs_base;
    tb->flags = flags;
    tb->cflags = cflags;
    tb->orig_tb = NULL;
    tb->trace_vcpu_dstate = *cpu->trace_dstate;
    tcg_ctx->tb_cflags = cflags;
 tb_overflow:

    tcg_func_start(tcg_ctx);

    tcg_ctx->cpu = env_cpu(env);
    UC_TRACE_START(UC_TRACE_TB_TRANS);
    gen_intermediate_code(cpu, tb, max_insns);
    UC_TRACE_END(UC_TRACE_TB_TRANS, "[uc] translate tb 0x%" PRIx64 ": ", tb->pc);
    tcg_ctx->cpu = NULL;

    /* generate machine code */
    tb->jmp_reset_offset[0] = TB_JMP_RESET_OFFSET_INVALID;
    tb->jmp_reset_offset[1] = TB_JMP_RESET_OFFSET_INVALID;
    tcg_ctx->tb_jmp_reset_offset = tb->jmp_reset_offset;
    if (TCG_TARGET_HAS_direct_jump) {
        tcg_ctx->tb_jmp_insn_offset = tb->jmp_target_arg;
        tcg_ctx->tb_jmp_target_addr = NULL;
    } else {
        tcg_ctx->tb_jmp_insn_offset = NULL;
        tcg_ctx->tb_jmp_target_addr = tb->jmp_target_arg;
    }

    gen_code_size = tcg_gen_code(tcg_ctx, tb);
    if (unlikely(gen_code_size < 0)) {
        switch (gen_code_size) {
        case -1:
            /*
             * Overflow of code_gen_buffer, or the current slice of it.
             *
             * TODO: We don't need to re-do gen_intermediate_code, nor
             * should we re-do the tcg optimization currently hidden
             * inside tcg_gen_code.  All that should be required is to
             * flush the TBs, allocate a new TB, re-initialize it per
             * above, and re-do the actual code generation.
             */
            goto buffer_overflow;

        case -2:
            /*
             * The code generated for the TranslationBlock is too large.
             * The maximum size allowed by the unwind info is 64k.
             * There may be stricter constraints from relocations
             * in the tcg backend.
             *
             * Try again with half as many insns as we attempted this time.
             * If a single insn overflows, there's a bug somewhere...
             */
            max_insns = tb->icount;
            assert(max_insns > 1);
            max_insns /= 2;
            goto tb_overflow;

        default:
            g_assert_not_reached();
        }
    }
    search_size = encode_search(cpu->uc, tb, (uint8_t *)gen_code_buf + gen_code_size);
    if (unlikely(search_size < 0)) {
        goto buffer_overflow;
    }
    tb->tc.size = gen_code_size;

    tcg_ctx->code_gen_ptr = (void *)
        ROUND_UP((uintptr_t)gen_code_buf + gen_code_size + search_size,
                 CODE_GEN_ALIGN);

    /* init jump list */
    tb->jmp_list_head = (uintptr_t)NULL;
    tb->jmp_list_next[0] = (uintptr_t)NULL;
    tb->jmp_list_next[1] = (uintptr_t)NULL;
    tb->jmp_dest[0] = (uintptr_t)NULL;
    tb->jmp_dest[1] = (uintptr_t)NULL;

    /* init original jump addresses which have been set during tcg_gen_code() */
    if (tb->jmp_reset_offset[0] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 0);
    }
    if (tb->jmp_reset_offset[1] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 1);
    }

    /* check next page if needed */
    virt_page2 = (pc + tb->size - 1) & TARGET_PAGE_MASK;
    phys_page2 = -1;
    if ((pc & TARGET_PAGE_MASK) != virt_page2) {
        phys_page2 = get_page_addr_code(env, virt_page2);
    }
    /*
     * No explicit memory barrier is required -- tb_link_page() makes the
     * TB visible in a consistent state.
     */
    existing_tb = tb_link_page(cpu->uc, tb, phys_pc, phys_page2);
    /* if the TB already exists, discard what we just translated */
    if (unlikely(existing_tb != tb)) {
        uintptr_t orig_aligned = (uintptr_t)gen_code_buf;

        orig_aligned -= ROUND_UP(sizeof(*tb), tcg_ctx->uc->qemu_icache_linesize);
        tcg_ctx->code_gen_ptr = (void *)orig_aligned;
        return existing_tb;
    }
    tcg_tb_insert(tcg_ctx, tb);
    return tb;
}